

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node *
lyd_new_path(lyd_node *data_tree,ly_ctx *ctx,char *path,void *value,LYD_ANYDATA_VALUETYPE value_type
            ,int options)

{
  byte bVar1;
  char cVar2;
  LYS_NODE LVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  LYD_ANYDATA_VALUETYPE LVar7;
  char *pcVar8;
  lyd_node_leaf_list *leaf;
  lys_module *plVar9;
  lys_node *last;
  lys_node *node;
  lyd_node *sibling;
  lys_node *plVar10;
  long lVar11;
  ushort **ppuVar12;
  lys_module *plVar13;
  char *pcVar14;
  lyd_node *plVar15;
  LY_ERR no;
  LY_ECODE LVar16;
  ly_ctx *plVar17;
  lyd_node *plVar18;
  LYS_NODE LVar19;
  ulong uVar20;
  LYD_ANYDATA_VALUETYPE LVar21;
  size_t sVar22;
  char *pcVar23;
  bool bVar24;
  char *local_118;
  char *val_name;
  char *val;
  int local_100;
  int local_fc;
  int val_name_len;
  int val_len;
  char *value_1;
  char *local_e8;
  char *mod_name_1;
  int val_len_1;
  uint local_d4;
  char *local_d0;
  char *name_1;
  int local_bc;
  lys_node *plStack_b8;
  int mod_name_len_1;
  int local_ac;
  int local_a8;
  int nam_len_1;
  int has_predicate;
  char *name;
  char *local_90;
  char *mod_name;
  lys_module *local_80;
  lyd_node *local_78;
  char *local_70;
  LYD_ANYDATA_VALUETYPE local_64;
  int local_60;
  int local_5c;
  int mod_name_len;
  int nam_len;
  uint local_4c;
  ly_ctx *plStack_48;
  int parsed;
  lyd_node *local_40;
  int local_34 [2];
  int is_relative;
  
  local_4c = 0;
  local_34[0] = -1;
  if ((path == (char *)0x0) || (data_tree == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0)) {
LAB_00160e66:
    path = "lyd_new_path";
LAB_00160e74:
    pcVar23 = "Invalid arguments (%s()).";
    no = LY_EINVAL;
    plVar17 = (ly_ctx *)0x0;
LAB_00160e7b:
    ly_log(plVar17,LY_LLERR,no,pcVar23,path);
    return (lyd_node *)0x0;
  }
  pcVar23 = path;
  if (data_tree == (lyd_node *)0x0) {
    if (*path != '/') goto LAB_00160e66;
    if (ctx == (ly_ctx *)0x0) goto LAB_00160e99;
    mod_name = (char *)0x0;
    name_1 = (char *)data_tree;
    leaf = (lyd_node_leaf_list *)mod_name;
    local_70 = (char *)value;
    local_64 = value_type;
    plStack_48 = ctx;
  }
  else {
    if (ctx == (ly_ctx *)0x0) {
LAB_00160e99:
      ctx = data_tree->schema->module->ctx;
    }
    pcVar8 = (char *)0x0;
    pcVar14 = (char *)value;
    if (LYD_ANYDATA_STRING < value_type) {
      pcVar14 = pcVar8;
    }
    plStack_48 = ctx;
    if (*path == '/') {
      leaf = (lyd_node_leaf_list *)0x0;
      name_1 = (char *)data_tree;
      local_70 = (char *)value;
      local_64 = value_type;
      for (; (uVar4 = (uint)pcVar8, uVar4 == 0 && (data_tree != (lyd_node *)0x0));
          data_tree = data_tree->next) {
        leaf = (lyd_node_leaf_list *)
               resolve_partial_json_data_nodeid(path,pcVar14,data_tree,options,(int *)&local_4c);
        pcVar8 = (char *)(ulong)local_4c;
      }
      if (uVar4 == 0) {
        plVar18 = (lyd_node *)name_1;
        uVar4 = 0;
        while (uVar4 == 0) {
          plVar18 = plVar18->prev;
          if (plVar18->next == (lyd_node *)0x0) goto LAB_00160f6b;
          leaf = (lyd_node_leaf_list *)
                 resolve_partial_json_data_nodeid(path,pcVar14,plVar18,options,(int *)&local_4c);
          uVar4 = local_4c;
        }
      }
    }
    else {
      name_1 = (char *)data_tree;
      local_70 = (char *)value;
      local_64 = value_type;
      leaf = (lyd_node_leaf_list *)
             resolve_partial_json_data_nodeid(path,pcVar14,data_tree,options,(int *)&local_4c);
      uVar4 = local_4c;
    }
    LVar21 = local_64;
    if (uVar4 == 0xffffffff) {
      return (lyd_node *)0x0;
    }
    if (uVar4 != 0) {
      if (leaf == (lyd_node_leaf_list *)0x0) {
        __assert_fail("parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x778,
                      "struct lyd_node *lyd_new_path(struct lyd_node *, const struct ly_ctx *, const char *, void *, LYD_ANYDATA_VALUETYPE, int)"
                     );
      }
      local_34[0] = 1;
      if (path[(int)uVar4] == '\0') {
        if ((options & 1U) == 0) {
          if (((options & 8U) != 0) || (bVar24 = true, (leaf->field_0x9 & 1) == 0)) {
            ly_vlog(plStack_48,LYE_PATH_EXISTS,LY_VLOG_STR,path);
            return (lyd_node *)0x0;
          }
        }
        else {
          bVar24 = (options & 8U) == 0;
          if ((!bVar24) && ((leaf->field_0x9 & 1) != 0)) {
            return (lyd_node *)0x0;
          }
        }
        plVar17 = leaf->schema->module->ctx;
        LVar19 = leaf->schema->nodetype;
        if ((LVar19 == LYS_ANYDATA) || (LVar19 == LYS_ANYXML)) {
          LVar7 = *(LYD_ANYDATA_VALUETYPE *)&leaf->field_0x34;
          if ((LVar7 | local_64) < LYD_ANYDATA_JSON) {
            iVar5 = ly_strequal_(leaf->value_str,local_70);
            if (iVar5 != 0) {
              return (lyd_node *)0x0;
            }
            LVar7 = *(LYD_ANYDATA_VALUETYPE *)&leaf->field_0x34;
          }
          else if ((LVar7 == local_64) && (LVar7 = local_64, leaf->value_str == local_70)) {
            return (lyd_node *)0x0;
          }
          switch(LVar7) {
          case LYD_ANYDATA_CONSTSTRING:
          case LYD_ANYDATA_JSON:
          case LYD_ANYDATA_SXML:
            lydict_remove(plVar17,leaf->value_str);
            break;
          case LYD_ANYDATA_STRING:
          case LYD_ANYDATA_JSOND:
          case LYD_ANYDATA_SXMLD:
switchD_00161ae3_caseD_1:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x718,
                          "struct lyd_node *lyd_new_path_update(struct lyd_node *, void *, LYD_ANYDATA_VALUETYPE, int)"
                         );
          case LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
          case LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
          case LYD_ANYDATA_XML|LYD_ANYDATA_STRING:
          case LYD_ANYDATA_XML|LYD_ANYDATA_JSON:
          case LYD_ANYDATA_XML|LYD_ANYDATA_JSOND:
          case LYD_ANYDATA_XML|LYD_ANYDATA_SXML:
          case LYD_ANYDATA_XML|LYD_ANYDATA_SXMLD:
          case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
          case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
            break;
          case LYD_ANYDATA_XML:
            lyxml_free_withsiblings(plVar17,(lyxml_elem *)leaf->value_str);
            break;
          case LYD_ANYDATA_DATATREE:
            lyd_free_withsiblings((lyd_node *)leaf->value_str);
            break;
          default:
            if (LVar7 == LYD_ANYDATA_LYB) {
              free(leaf->value_str);
            }
            else if (LVar7 == LYD_ANYDATA_LYBD) goto switchD_00161ae3_caseD_1;
          }
          switch(LVar21) {
          case LYD_ANYDATA_CONSTSTRING:
          case LYD_ANYDATA_JSON:
          case LYD_ANYDATA_SXML:
            pcVar23 = lydict_insert(plVar17,local_70,0);
            break;
          case LYD_ANYDATA_STRING:
          case LYD_ANYDATA_JSOND:
          case LYD_ANYDATA_SXMLD:
            pcVar23 = lydict_insert_zc(plVar17,local_70);
            break;
          case LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
          case LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
          case LYD_ANYDATA_XML|LYD_ANYDATA_STRING:
          case LYD_ANYDATA_XML|LYD_ANYDATA_JSON:
          case LYD_ANYDATA_XML|LYD_ANYDATA_JSOND:
          case LYD_ANYDATA_XML|LYD_ANYDATA_SXML:
          case LYD_ANYDATA_XML|LYD_ANYDATA_SXMLD:
          case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
          case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
            return (lyd_node *)leaf;
          case LYD_ANYDATA_XML:
          case LYD_ANYDATA_DATATREE:
switchD_00161c1e_caseD_8:
            leaf->value_str = local_70;
            return (lyd_node *)leaf;
          default:
            if (LVar21 != LYD_ANYDATA_LYB) {
              if (LVar21 != LYD_ANYDATA_LYBD) {
                return (lyd_node *)leaf;
              }
              goto switchD_00161c1e_caseD_8;
            }
            iVar5 = lyd_lyb_data_length(local_70);
            if (iVar5 == -1) {
              ly_log(plVar17,LY_LLERR,LY_EINVAL,"Invalid LYB data.");
              return (lyd_node *)0x0;
            }
            pcVar23 = (char *)malloc((long)iVar5);
            leaf->value_str = pcVar23;
            if (pcVar23 != (char *)0x0) {
              memcpy(pcVar23,local_70,(long)iVar5);
              return (lyd_node *)leaf;
            }
            pcVar23 = "Memory allocation failed (%s()).";
            path = "lyd_new_path_update";
            no = LY_EMEM;
            goto LAB_00160e7b;
          }
          leaf->value_str = pcVar23;
          return (lyd_node *)leaf;
        }
        if (LVar19 != LYS_LEAF) {
          return (lyd_node *)0x0;
        }
        if (local_64 < LYD_ANYDATA_JSON) {
          iVar5 = lyd_change_leaf(leaf,local_70);
          if (iVar5 == 0) {
            if (bVar24) {
              return (lyd_node *)leaf;
            }
          }
          else if (bVar24) {
            return (lyd_node *)0x0;
          }
          leaf->field_0x9 = leaf->field_0x9 | 1;
          return (lyd_node *)leaf;
        }
        path = "lyd_new_path_update";
        goto LAB_00160e74;
      }
      pcVar23 = path + (int)uVar4;
    }
  }
LAB_00160f6b:
  mod_name = (char *)leaf;
  iVar5 = local_34[0];
  uVar4 = parse_schema_nodeid(pcVar23,&local_90,&local_60,(char **)&has_predicate,&local_5c,local_34
                              ,(int *)0x0,(int *)0x0,1);
  if ((int)uVar4 < 1) {
    _has_predicate = (lyd_node *)(pcVar23 + -uVar4);
    cVar2 = pcVar23[-uVar4];
  }
  else {
    _mod_name_len = pcVar23;
    if (*(char *)&_has_predicate->schema == '#') {
      if (local_34[0] != 0) {
        uVar20 = 0x23;
        goto LAB_001618fa;
      }
      pcVar8 = (char *)((long)&_has_predicate->schema + 1);
      value_1 = (char *)CONCAT44(value_1._4_4_,local_5c + -1);
      local_80 = (lys_module *)CONCAT44(local_80._4_4_,local_60);
      pcVar14 = local_90;
      _mod_name_len = pcVar23 + uVar4;
    }
    else {
      pcVar14 = (char *)0x0;
      pcVar8 = (char *)0x0;
      local_34[0] = iVar5;
    }
    pcVar23 = _mod_name_len;
    uVar4 = parse_schema_nodeid(_mod_name_len,&local_90,&local_60,(char **)&has_predicate,&local_5c,
                                local_34,&local_a8,(int *)0x0,0);
    plVar17 = plStack_48;
    if (0 < (int)uVar4) {
      if (pcVar14 != (char *)0x0) {
        local_60 = (int)local_80;
        local_90 = pcVar14;
      }
      iVar5 = (int)value_1;
      if (local_34[0] != 0) {
        if (name_1 != (char *)0x0) {
          plVar18 = (lyd_node *)mod_name;
          if (mod_name == (char *)0x0) {
            plVar18 = (lyd_node *)name_1;
          }
          plVar10 = plVar18->schema;
          local_80 = (lys_module *)(ulong)uVar4;
          plVar9 = lys_node_module(plVar10);
          local_78 = plVar18;
          goto LAB_0016112a;
        }
        pcVar23 = "%s: provided relative path (%s) without context node.";
        no = LY_EINVAL;
        goto LAB_00160e7b;
      }
      if (mod_name != (char *)0x0) {
        __assert_fail("!parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x7bd,
                      "struct lyd_node *lyd_new_path(struct lyd_node *, const struct ly_ctx *, const char *, void *, LYD_ANYDATA_VALUETYPE, int)"
                     );
      }
      if (local_90 == (char *)0x0) {
        pcVar23 = strndup(path,(size_t)((long)_has_predicate + ((long)local_5c - (long)path)));
        LVar16 = LYE_PATH_MISSMOD;
      }
      else {
        local_80 = (lys_module *)(ulong)uVar4;
        plVar9 = ly_ctx_nget_module(plStack_48,local_90,(long)local_60,(char *)0x0,1);
        if (plVar9 != (lys_module *)0x0) {
          local_90 = (char *)0x0;
          local_60 = 0;
          if (pcVar8 == (char *)0x0) {
            local_78 = (lyd_node *)0x0;
            plVar10 = (lys_node *)0x0;
          }
          else {
            plVar10 = lyp_get_yang_data_template(plVar9,pcVar8,iVar5);
            if (plVar10 == (lys_node *)0x0) {
              pcVar23 = strndup(path,(size_t)(pcVar8 + ((long)iVar5 - (long)path)));
              LVar16 = LYE_PATH_INNODE;
              plVar17 = plStack_48;
              goto LAB_00161aa1;
            }
            local_78 = (lyd_node *)0x0;
          }
LAB_0016112a:
          _mod_name_len = _mod_name_len + ((ulong)local_80 & 0xffffffff);
          local_d4 = (uint)options >> 3 & 1;
          val_len_1 = (options & 4U) * 0x80 + 0x200;
          local_40 = (lyd_node *)0x0;
          plStack_b8 = (lys_node *)0x0;
          value_1 = (char *)plVar9;
          nam_len_1 = options;
          local_80 = plVar9;
          do {
            last = (lys_node *)0x0;
LAB_0016117b:
            do {
              last = lys_getnext(last,plVar10,(lys_module *)value_1,0);
              pcVar23 = local_90;
              if (last == (lys_node *)0x0) {
                pcVar23 = strndup(path,(size_t)((long)_has_predicate + ((long)local_5c - (long)path)
                                               ));
                LVar16 = LYE_PATH_INNODE;
                plVar17 = plStack_48;
                goto LAB_00161929;
              }
            } while ((last->nodetype & 0xc1bd) == LYS_UNKNOWN);
            plVar9 = lys_node_module(last);
            if (pcVar23 == (char *)0x0) {
              if (plVar9 != local_80) goto LAB_0016117b;
            }
            else {
              pcVar23 = plVar9->name;
              sVar22 = (size_t)local_60;
              iVar5 = strncmp(pcVar23,local_90,sVar22);
              if ((iVar5 != 0) || (pcVar23[sVar22] != '\0')) goto LAB_0016117b;
            }
            pcVar23 = last->name;
            sVar22 = (size_t)local_5c;
            iVar5 = strncmp(pcVar23,(char *)_has_predicate,sVar22);
            if ((iVar5 != 0) || (node = last, pcVar23[sVar22] != '\0')) goto LAB_0016117b;
            do {
              node = lys_parent(node);
              plVar17 = plStack_48;
              LVar21 = local_64;
              LVar19 = val_len_1;
              if (node == (lys_node *)0x0) goto LAB_00161250;
              LVar3 = node->nodetype;
            } while (LVar3 == LYS_USES);
            if ((nam_len_1 & 4U) == 0) {
              if (LVar3 != LYS_OUTPUT) goto LAB_00161250;
              goto LAB_0016117b;
            }
            if (LVar3 == LYS_INPUT) goto LAB_0016117b;
LAB_00161250:
            LVar3 = last->nodetype;
            if (LVar3 != LYS_CONTAINER) {
              if ((LVar3 == LYS_LEAF) || (LVar3 == LYS_LEAFLIST)) {
                if (local_a8 == 0) {
                  pcVar23 = (char *)0x0;
LAB_001613d2:
                  plVar17 = plStack_48;
                  if ((int)*_mod_name_len != 0) {
                    ly_vlog(plStack_48,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                            (ulong)(uint)(int)*_mod_name_len,_mod_name_len);
                    goto LAB_00161936;
                  }
                  if (((nam_len_1 & 0x20U) == 0) || (iVar5 = 1, last->nodetype != LYS_LEAF)) {
                    iVar5 = 0;
                  }
                  plVar18 = local_78;
                  if (local_34[0] == 0) {
                    plVar18 = (lyd_node *)0x0;
                  }
                  pcVar14 = pcVar23;
                  if (pcVar23 == (char *)0x0) {
                    pcVar14 = local_70;
                  }
                  local_64 = LVar21;
                  plVar18 = _lyd_new_leaf(plVar18,last,pcVar14,local_d4,iVar5);
                  free(pcVar23);
                  LVar21 = local_64;
                  LVar19 = val_len_1;
                  goto LAB_00161444;
                }
                uVar4 = parse_schema_json_predicate
                                  (_mod_name_len,(char **)0x0,(int *)0x0,&local_118,&local_100,
                                   &val_name,&local_fc,&local_a8);
                if ((int)uVar4 < 1) {
                  pcVar23 = _mod_name_len + -uVar4;
                  uVar20 = (ulong)(uint)(int)_mod_name_len[-uVar4];
                }
                else {
                  uVar20 = (ulong)(uint)(int)*local_118;
                  pcVar23 = local_118;
                  if (((int)*local_118 == 0x2e) && (local_100 == 1)) {
                    pcVar23 = strndup(val_name,(long)local_fc);
                    if (pcVar23 != (char *)0x0) {
                      _mod_name_len = _mod_name_len + uVar4;
                      goto LAB_001613d2;
                    }
                    ly_log(plStack_48,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                           "lyd_new_path");
                    plVar18 = local_40;
                    goto LAB_0016193f;
                  }
                }
LAB_00161e0e:
                ly_vlog(plStack_48,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar20,pcVar23);
                plVar18 = local_40;
              }
              else {
                if (LVar3 == LYS_LIST) goto LAB_001612a9;
                if (LVar3 == LYS_ANYXML) {
LAB_001612da:
                  uVar20 = (ulong)(uint)(int)*_mod_name_len;
                  pcVar23 = _mod_name_len;
                  if ((int)*_mod_name_len != 0) goto LAB_00161e0e;
                  if (local_70 == (char *)0x0 && local_64 < LYD_ANYDATA_JSON) {
                    LVar21 = LYD_ANYDATA_CONSTSTRING;
                    local_70 = "";
                  }
                  plVar18 = local_78;
                  if (local_34[0] == 0) {
                    plVar18 = (lyd_node *)0x0;
                  }
                  plVar18 = lyd_create_anydata(plVar18,last,local_70,LVar21);
                  plVar17 = plStack_48;
                  goto LAB_00161444;
                }
                if ((LVar3 == LYS_NOTIF) || (LVar3 == LYS_RPC)) goto LAB_001612a9;
                if (LVar3 == LYS_ANYDATA) goto LAB_001612da;
                if (LVar3 == LYS_ACTION) goto LAB_001612a9;
                ly_log(plStack_48,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                       ,0x854);
LAB_00161e64:
                pcVar23 = strndup(path,(long)_mod_name_len - (long)path);
                if (local_34[0] == 0) {
                  ly_vlog(plVar17,LYE_SPEC,LY_VLOG_STR,pcVar23,"Failed to create node \"%s\".",
                          last->name);
                }
                else {
                  ly_vlog(plVar17,LYE_SPEC,LY_VLOG_STR,pcVar23,
                          "Failed to create node \"%s\" as a child of \"%s\".",last->name,
                          local_78->schema->name);
                }
                plVar18 = local_40;
                free(pcVar23);
              }
              goto LAB_0016193f;
            }
LAB_001612a9:
            if ((nam_len_1 & 2U) != 0) {
              pcVar23 = strndup(path,(size_t)((long)_has_predicate + ((long)local_5c - (long)path)))
              ;
              LVar16 = LYE_PATH_MISSPAR;
LAB_00161929:
              ly_vlog(plVar17,LVar16,LY_VLOG_STR,pcVar23);
LAB_00161936:
              free(pcVar23);
              plVar18 = local_40;
              goto LAB_0016193f;
            }
            plVar18 = local_78;
            if (local_34[0] == 0) {
              plVar18 = (lyd_node *)0x0;
            }
            plVar18 = _lyd_new(plVar18,last,local_d4);
LAB_00161444:
            name = (char *)plVar18;
            if (plVar18 == (lyd_node *)0x0) goto LAB_00161e64;
            local_64 = LVar21;
            if (local_34[0] == 0) {
              plVar15 = (lyd_node *)name_1;
              if (name_1 == (char *)0x0) {
                sibling = (lyd_node *)0x0;
              }
              else {
                do {
                  sibling = plVar15;
                  plVar15 = sibling->next;
                } while (sibling->next != (lyd_node *)0x0);
                iVar5 = lyd_insert_after(sibling,plVar18);
                plVar18 = local_40;
                if (iVar5 != 0) goto LAB_0016193f;
              }
              name_1 = (char *)sibling;
              local_34[0] = 1;
            }
            plVar15 = local_40;
            if (((ulong)plStack_b8 & 1) == 0) {
              plVar10 = *(lys_node **)name;
              do {
                plVar10 = lys_parent(plVar10);
                plVar15 = (lyd_node *)name;
                if (plVar10 == (lys_node *)0x0) goto LAB_001614f2;
              } while (plVar10->nodetype != LVar19);
              iVar5 = lyd_schema_sort((lyd_node *)name,0);
              plVar18 = local_40;
              if (iVar5 != 0) goto LAB_0016193f;
            }
LAB_001614f2:
            local_4c = 0;
            mod_name = (char *)plVar15;
            if (last->nodetype == LYS_LIST) {
              lVar11 = 0;
              if (local_a8 != 0) {
                val = (char *)_has_predicate;
                plVar10 = *(lys_node **)name;
                iVar5 = parse_schema_json_predicate
                                  (_mod_name_len,&local_e8,&local_bc,&local_d0,&local_ac,
                                   (char **)&val_name_len,(int *)&mod_name_1,
                                   (int *)((long)&mod_name_1 + 4));
                pcVar23 = local_d0;
                if ((iVar5 < 1) || (iVar6 = strncmp(local_d0,".",(long)local_ac), iVar6 == 0)) {
                  uVar4 = (uint)_mod_name_len[-(long)iVar5];
                  plVar17 = plVar10->module->ctx;
                  pcVar23 = _mod_name_len + -(long)iVar5;
                  goto LAB_00161cf4;
                }
                ppuVar12 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar12 + (long)*pcVar23 * 2 + 1) & 8) == 0) {
                  if (plVar10->padding[2] != '\0') {
                    local_40 = (lyd_node *)0x0;
                    pcVar23 = _mod_name_len;
                    plStack_b8 = plVar10;
                    do {
                      local_80 = *(lys_module **)(*(long *)&plVar10[1].flags + (long)local_40 * 8);
                      local_78 = (lyd_node *)CONCAT44(local_78._4_4_,iVar5);
                      local_4c = local_4c + iVar5;
                      if (_val_name_len == (char *)0x0) {
LAB_00161bd0:
                        plVar17 = plStack_b8->module->ctx;
                        LVar16 = LYE_PATH_INKEY;
LAB_00161bec:
                        ly_vlog(plVar17,LVar16,LY_VLOG_NONE,(void *)0x0,local_d0);
                        plVar18 = (lyd_node *)mod_name;
                        goto LAB_0016193f;
                      }
                      if (local_e8 == (char *)0x0) {
                        plVar9 = lys_node_module((lys_node *)local_80);
                        plVar13 = lys_node_module(plStack_b8);
                        if (plVar9 == plVar13) {
                          if (local_e8 != (char *)0x0) goto LAB_0016163a;
                          goto LAB_00161680;
                        }
                        goto LAB_00161bd0;
                      }
LAB_0016163a:
                      plVar9 = lys_node_module((lys_node *)local_80);
                      iVar5 = strncmp(plVar9->name,local_e8,(long)local_bc);
                      if ((iVar5 != 0) ||
                         (plVar9 = lys_node_module((lys_node *)local_80),
                         plVar9->name[local_bc] != '\0')) goto LAB_00161bd0;
LAB_00161680:
                      plVar17 = local_80->ctx;
                      sVar22 = (size_t)local_ac;
                      iVar5 = strncmp((char *)plVar17,local_d0,sVar22);
                      if ((iVar5 != 0) ||
                         (*(char *)((long)&(plVar17->dict).hash_tab + sVar22) != '\0'))
                      goto LAB_00161bd0;
                      sVar22 = (size_t)(int)mod_name_1;
                      pcVar14 = (char *)malloc(sVar22 + 1);
                      if (pcVar14 == (char *)0x0) {
                        ly_log(plStack_b8->module->ctx,LY_LLERR,LY_EMEM,
                               "Memory allocation failed (%s()).","lyd_new_path_list_predicate");
                        plVar18 = (lyd_node *)mod_name;
                        goto LAB_0016193f;
                      }
                      strncpy(pcVar14,_val_name_len,sVar22);
                      pcVar14[sVar22] = '\0';
                      plVar15 = _lyd_new_leaf((lyd_node *)name,(lys_node *)local_80,pcVar14,0,0);
                      free(pcVar14);
                      plVar10 = plStack_b8;
                      plVar18 = (lyd_node *)mod_name;
                      if (plVar15 == (lyd_node *)0x0) goto LAB_0016193f;
                      local_40 = (lyd_node *)((long)&local_40->schema + 1);
                      if ((lyd_node *)(ulong)plStack_b8->padding[2] <= local_40) break;
                      if (mod_name_1._4_4_ == 0) {
                        plVar17 = plStack_b8->module->ctx;
                        LVar16 = LYE_PATH_MISSKEY;
                        local_d0 = val;
                        goto LAB_00161bec;
                      }
                      pcVar23 = pcVar23 + ((ulong)local_78 & 0xffffffff);
                      iVar5 = parse_schema_json_predicate
                                        (pcVar23,&local_e8,&local_bc,&local_d0,&local_ac,
                                         (char **)&val_name_len,(int *)&mod_name_1,
                                         (int *)((long)&mod_name_1 + 4));
                      if ((iVar5 < 1) || (iVar6 = strncmp(local_d0,".",(long)local_ac), iVar6 == 0))
                      {
                        uVar4 = (uint)pcVar23[-(long)iVar5];
                        plVar17 = plVar10->module->ctx;
                        pcVar23 = pcVar23 + -(long)iVar5;
                        goto LAB_00161cf4;
                      }
                    } while( true );
                  }
                }
                else {
                  local_4c = local_4c + iVar5;
                }
                lVar11 = (long)(int)local_4c;
              }
            }
            else {
              lVar11 = 0;
            }
            if (_mod_name_len[lVar11] == '\0') {
              if ((nam_len_1 & 0x10U) != 0) {
                return (lyd_node *)name;
              }
              return (lyd_node *)mod_name;
            }
            pcVar14 = _mod_name_len + lVar11;
            local_80 = lys_node_module(last);
            uVar4 = parse_schema_nodeid(pcVar14,&local_90,&local_60,(char **)&has_predicate,
                                        &local_5c,local_34,&local_a8,(int *)0x0,0);
            if ((int)uVar4 < 1) {
              pcVar23 = pcVar14 + -uVar4;
              uVar4 = (uint)pcVar14[-uVar4];
              plVar17 = plStack_48;
LAB_00161cf4:
              ly_vlog(plVar17,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)uVar4,pcVar23);
              plVar18 = (lyd_node *)mod_name;
LAB_0016193f:
              lyd_free(plVar18);
              return (lyd_node *)0x0;
            }
            _mod_name_len = pcVar14 + uVar4;
            plStack_b8 = (lys_node *)CONCAT71((uint7)(uint3)(uVar4 >> 8),1);
            local_40 = (lyd_node *)mod_name;
            local_78 = (lyd_node *)name;
            plVar10 = last;
            if (last->nodetype == LYS_LIST) {
              if (local_90 == (char *)0x0) {
                bVar1 = last->padding[2];
                local_78 = _has_predicate;
                local_40 = (lyd_node *)(long)local_5c;
                for (uVar20 = 0; bVar1 != uVar20; uVar20 = uVar20 + 1) {
                  pcVar23 = (char *)**(undefined8 **)(*(long *)&last[1].flags + uVar20 * 8);
                  iVar5 = strncmp(pcVar23,(char *)local_78,(size_t)local_40);
                  if ((iVar5 == 0) && (pcVar23[(long)local_40] == '\0')) {
                    uVar4 = (uint)*_mod_name_len;
                    plVar17 = plStack_48;
                    pcVar23 = _mod_name_len;
                    if (uVar4 == 0) {
                      return (lyd_node *)mod_name;
                    }
                    goto LAB_00161cf4;
                  }
                }
                local_40 = (lyd_node *)mod_name;
                local_78 = (lyd_node *)name;
              }
            }
          } while( true );
        }
        pcVar23 = strndup(path,(size_t)(local_90 + ((long)local_60 - (long)path)));
        LVar16 = LYE_PATH_INMOD;
      }
LAB_00161aa1:
      ly_vlog(plVar17,LVar16,LY_VLOG_STR,pcVar23);
      free(pcVar23);
      return (lyd_node *)0x0;
    }
    _has_predicate = (lyd_node *)(pcVar23 + -uVar4);
    cVar2 = pcVar23[-uVar4];
  }
  uVar20 = (ulong)(uint)(int)cVar2;
LAB_001618fa:
  ly_vlog(plStack_48,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar20,_has_predicate);
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_path(struct lyd_node *data_tree, const struct ly_ctx *ctx, const char *path, void *value,
             LYD_ANYDATA_VALUETYPE value_type, int options)
{
    char *str;
    const char *mod_name, *name, *val_name, *val, *node_mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    struct lyd_node *ret = NULL, *node, *parent = NULL;
    const struct lys_node *schild, *sparent, *tmp;
    const struct lys_node_list *slist;
    const struct lys_module *module, *prev_mod;
    int r, i, parsed = 0, mod_name_len, nam_len, val_name_len, val_len;
    int is_relative = -1, has_predicate, first_iter = 1, edit_leaf;
    int backup_is_relative, backup_mod_name_len, yang_data_name_len;

    if (!path || (!data_tree && !ctx)
            || (!data_tree && (path[0] != '/'))) {
        LOGARG;
        return NULL;
    }

    if (!ctx) {
        ctx = data_tree->schema->module->ctx;
    }

    id = path;

    if (data_tree) {
        if (path[0] == '/') {
            /* absolute path, go through all the siblings and try to find the right parent, if exists,
             * first go through all the next siblings keeping the original order, for positional predicates */
            for (node = data_tree; !parsed && node; node = node->next) {
                parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, node,
                                                          options, &parsed);
            }
            if (!parsed) {
                for (node = data_tree->prev; !parsed && node->next; node = node->prev) {
                    parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, node,
                                                              options, &parsed);
                }
            }
        } else {
            /* relative path, use only the provided data tree root */
            parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, data_tree,
                                                      options, &parsed);
        }
        if (parsed == -1) {
            return NULL;
        }
        if (parsed) {
            assert(parent);
            /* if we parsed something we have a relative path now for sure, otherwise we don't know */
            is_relative = 1;

            id += parsed;

            if (!id[0]) {
                /* the node exists, are we supposed to update it or is it default? */
                if (!(options & LYD_PATH_OPT_UPDATE) && (!parent->dflt || (options & LYD_PATH_OPT_DFLT))) {
                    LOGVAL(ctx, LYE_PATH_EXISTS, LY_VLOG_STR, path);
                    return NULL;
                }

                /* no change, the default node already exists */
                if (parent->dflt && (options & LYD_PATH_OPT_DFLT)) {
                    return NULL;
                }

                return lyd_new_path_update(parent, value, value_type, options & LYD_PATH_OPT_DFLT);
            }
        }
    }

    backup_is_relative = is_relative;
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return NULL;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        /* move to the next node in the path */
        id += r;
    } else {
        is_relative = backup_is_relative;
    }

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    /* move to the next node in the path */
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    /* prepare everything for the schema search loop */
    if (is_relative) {
        /* we are relative to data_tree or parent if some part of the path already exists */
        if (!data_tree) {
            LOGERR(ctx, LY_EINVAL, "%s: provided relative path (%s) without context node.", path);
            return NULL;
        } else if (!parent) {
            parent = data_tree;
        }
        sparent = parent->schema;
        module = prev_mod = lys_node_module(sparent);
    } else {
        /* we are starting from scratch, absolute path */
        assert(!parent);
        if (!mod_name) {
            str = strndup(path, (name + nam_len) - path);
            LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        module = ly_ctx_nget_module(ctx, mod_name, mod_name_len, NULL, 1);

        if (!module) {
            str = strndup(path, (mod_name + mod_name_len) - path);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        mod_name = NULL;
        mod_name_len = 0;
        prev_mod = module;

        sparent = NULL;
        if (yang_data_name) {
            sparent = lyp_get_yang_data_template(module, yang_data_name, yang_data_name_len);
            if (!sparent) {
                str = strndup(path, (yang_data_name + yang_data_name_len) - path);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return NULL;
            }
        }
    }

    /* create nodes in a loop */
    while (1) {
        /* find the schema node */
        schild = NULL;
        while ((schild = lys_getnext(schild, sparent, module, 0))) {
            if (schild->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST
                                    | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
                /* module comparison */
                if (mod_name) {
                    node_mod_name = lys_node_module(schild)->name;
                    if (strncmp(node_mod_name, mod_name, mod_name_len) || node_mod_name[mod_name_len]) {
                        continue;
                    }
                } else if (lys_node_module(schild) != prev_mod) {
                    continue;
                }

                /* name check */
                if (strncmp(schild->name, name, nam_len) || schild->name[nam_len]) {
                    continue;
                }

                /* RPC/action in/out check */
                for (tmp = lys_parent(schild); tmp && (tmp->nodetype == LYS_USES); tmp = lys_parent(tmp));
                if (tmp) {
                    if (options & LYD_PATH_OPT_OUTPUT) {
                        if (tmp->nodetype == LYS_INPUT) {
                            continue;
                        }
                    } else {
                        if (tmp->nodetype == LYS_OUTPUT) {
                            continue;
                        }
                    }
                }

                break;
            }
        }

        if (!schild) {
            str = strndup(path, (name + nam_len) - path);
            LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            lyd_free(ret);
            return NULL;
        }

        /* we have the right schema node */
        switch (schild->nodetype) {
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            if (options & LYD_PATH_OPT_NOPARENT) {
                /* these were supposed to exist */
                str = strndup(path, (name + nam_len) - path);
                LOGVAL(ctx, LYE_PATH_MISSPAR, LY_VLOG_STR, str);
                free(str);
                lyd_free(ret);
                return NULL;
            }
            node = _lyd_new(is_relative ? parent : NULL, schild, (options & LYD_PATH_OPT_DFLT) ? 1 : 0);
            break;
        case LYS_LEAF:
        case LYS_LEAFLIST:
            str = NULL;
            if (has_predicate) {
                if ((r = parse_schema_json_predicate(id, NULL, NULL, &val_name, &val_name_len, &val, &val_len, &has_predicate)) < 1) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                    lyd_free(ret);
                    return NULL;
                }
                id += r;

                if ((val_name[0] != '.') || (val_name_len != 1)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, val_name[0], val_name);
                    lyd_free(ret);
                    return NULL;
                }

                str = strndup(val, val_len);
                if (!str) {
                    LOGMEM(ctx);
                    lyd_free(ret);
                    return NULL;
                }
            }
            if (id[0]) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                free(str);
                lyd_free(ret);
                return NULL;
            }

            if ((options & LYD_PATH_OPT_EDIT) && schild->nodetype == LYS_LEAF) {
                edit_leaf = 1;
            } else {
                edit_leaf = 0;
            }
            node = _lyd_new_leaf(is_relative ? parent : NULL, schild, (str ? str : value),
                                 (options & LYD_PATH_OPT_DFLT) ? 1 : 0, edit_leaf);
            free(str);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            if (id[0]) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                lyd_free(ret);
                return NULL;
            }
            if (value_type <= LYD_ANYDATA_STRING && !value) {
                value_type = LYD_ANYDATA_CONSTSTRING;
                value = "";
            }
            node = lyd_create_anydata(is_relative ? parent : NULL, schild, value, value_type);
            break;
        default:
            LOGINT(ctx);
            node = NULL;
            break;
        }

        if (!node) {
            str = strndup(path, id - path);
            if (is_relative) {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, str, "Failed to create node \"%s\" as a child of \"%s\".",
                       schild->name, parent->schema->name);
            } else {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, str, "Failed to create node \"%s\".", schild->name);
            }
            free(str);
            lyd_free(ret);
            return NULL;
        }
        /* special case when we are creating a sibling of a top-level data node */
        if (!is_relative) {
            if (data_tree) {
                for (; data_tree->next; data_tree = data_tree->next);
                if (lyd_insert_after(data_tree, node)) {
                    lyd_free(ret);
                    return NULL;
                }
            }
            is_relative = 1;
        }

        if (first_iter) {
            /* sort if needed, but only when inserted somewhere */
            sparent = node->schema;
            do {
                sparent = lys_parent(sparent);
            } while (sparent && (sparent->nodetype != ((options & LYD_PATH_OPT_OUTPUT) ? LYS_OUTPUT : LYS_INPUT)));
            if (sparent && lyd_schema_sort(node, 0)) {
                lyd_free(ret);
                return NULL;
            }

            /* set first created node */
            ret = node;
            first_iter = 0;
        }

        parsed = 0;
        if ((schild->nodetype == LYS_LIST) && has_predicate && lyd_new_path_list_predicate(node, name, id, &parsed)) {
            lyd_free(ret);
            return NULL;
        }
        id += parsed;

        if (!id[0]) {
            /* we are done */
            if (options & LYD_PATH_OPT_NOPARENTRET) {
                /* last created node */
                return node;
            }
            return ret;
        }

        /* prepare for another iteration */
        parent = node;
        sparent = schild;
        prev_mod = lys_node_module(schild);

        /* parse another node */
        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            lyd_free(ret);
            return NULL;
        }
        id += r;

        /* if a key of a list was supposed to be created, it is created as a part of the list instance creation */
        if ((schild->nodetype == LYS_LIST) && !mod_name) {
            slist = (const struct lys_node_list *)schild;
            for (i = 0; i < slist->keys_size; ++i) {
                if (!strncmp(slist->keys[i]->name, name, nam_len) && !slist->keys[i]->name[nam_len]) {
                    /* the path continues? there cannot be anything after a key (leaf) */
                    if (id[0]) {
                        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        lyd_free(ret);
                        return NULL;
                    }
                    return ret;
                }
            }
        }
    }

    LOGINT(ctx);
    return NULL;
}